

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
FindInitFaceConfiguration
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          FaceIndex face_id,CornerIndex *out_corner)

{
  int iVar1;
  CornerTable *pCVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar7 = face_id.value_ * 3;
  pCVar2 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  bVar9 = false;
  uVar6 = 0;
  do {
    uVar8 = (ulong)uVar7;
    if ((uVar7 == 0xffffffff) ||
       (lVar3 = *(long *)&(pCVar2->opposite_corners_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       , *(int *)(lVar3 + uVar8 * 4) == -1)) goto LAB_0013f8e2;
    if ((this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start
        [*(uint *)(*(long *)&(pCVar2->corner_to_vertex_map_).vector_ + uVar8 * 4)] != -1)
    goto LAB_0013f8a6;
    uVar4 = uVar7 + 1;
    uVar7 = uVar7 - 2;
    if (0x55555555 < uVar4 * -0x55555555) {
      uVar7 = uVar4;
    }
    bVar9 = 1 < uVar6;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 3);
  bVar9 = true;
LAB_0013f8e2:
  out_corner->value_ = uVar7;
  return bVar9;
LAB_0013f8a6:
  iVar5 = (int)uVar8;
  if ((uint)(iVar5 * -0x55555555) < 0x55555556) {
    uVar6 = iVar5 + 2;
    if (uVar6 == 0xffffffff) goto LAB_0013f8d1;
  }
  else {
    uVar6 = iVar5 - 1;
  }
  iVar1 = *(int *)(lVar3 + (ulong)uVar6 * 4);
  if ((iVar1 == -1) ||
     (uVar6 = (((uint)(iVar1 * -0x55555555) < 0x55555556) - 1 | 2) + iVar1, uVar8 = (ulong)uVar6,
     uVar6 == 0xffffffff)) goto LAB_0013f8d1;
  goto LAB_0013f8a6;
LAB_0013f8d1:
  uVar7 = (((uint)(iVar5 * -0x55555555) < 0x55555556) - 1 | 2) + iVar5;
  goto LAB_0013f8e2;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::FindInitFaceConfiguration(
    FaceIndex face_id, CornerIndex *out_corner) const {
  CornerIndex corner_index = CornerIndex(3 * face_id.value());
  for (int i = 0; i < 3; ++i) {
    if (corner_table_->Opposite(corner_index) == kInvalidCornerIndex) {
      // If there is a boundary edge, the configuration is exterior and return
      // the CornerIndex opposite to the first boundary edge.
      *out_corner = corner_index;
      return false;
    }
    if (vertex_hole_id_[corner_table_->Vertex(corner_index).value()] != -1) {
      // Boundary vertex found. Find the first boundary edge attached to the
      // point and return the corner opposite to it.
      CornerIndex right_corner = corner_index;
      while (right_corner != kInvalidCornerIndex) {
        corner_index = right_corner;
        right_corner = corner_table_->SwingRight(right_corner);
      }
      // |corner_index| now lies on a boundary edge and its previous corner is
      // guaranteed to be the opposite corner of the boundary edge.
      *out_corner = corner_table_->Previous(corner_index);
      return false;
    }
    corner_index = corner_table_->Next(corner_index);
  }
  // Else we have an interior configuration. Return the first corner id.
  *out_corner = corner_index;
  return true;
}